

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Aig_Man_t * Saig_ManUnrollCOI_(Aig_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  int local_2c;
  Aig_Obj_t **ppAStack_28;
  int i;
  Aig_Obj_t **pObjMap;
  Aig_Man_t *pFrames;
  Aig_Man_t *pAStack_10;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  pFrames._4_4_ = nFrames;
  pAStack_10 = p;
  pObjMap = (Aig_Obj_t **)Aig_ManFrames(p,nFrames,0,1,1,0,&stack0xffffffffffffffd8);
  local_2c = 0;
  while( true ) {
    iVar2 = pFrames._4_4_;
    iVar1 = Aig_ManObjNumMax(pAStack_10);
    if (iVar2 * iVar1 <= local_2c) break;
    if (ppAStack_28[local_2c] != (Aig_Obj_t *)0x0) {
      pObj = Aig_Regular(ppAStack_28[local_2c]);
      iVar2 = Aig_ObjIsNone(pObj);
      if (iVar2 != 0) {
        ppAStack_28[local_2c] = (Aig_Obj_t *)0x0;
      }
    }
    local_2c = local_2c + 1;
  }
  if (pAStack_10->pObjCopies == (Aig_Obj_t **)0x0) {
    pAStack_10->pObjCopies = ppAStack_28;
    return (Aig_Man_t *)pObjMap;
  }
  __assert_fail("p->pObjCopies == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                ,0x19f,"Aig_Man_t *Saig_ManUnrollCOI_(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI_( Aig_Man_t * p, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t ** pObjMap;
    int i;
//Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFrames, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
    pFrames = Aig_ManFrames( p, nFrames, 0, 1, 1, 0, &pObjMap );
    for ( i = 0; i < nFrames * Aig_ManObjNumMax(p); i++ )
        if ( pObjMap[i] && Aig_ObjIsNone( Aig_Regular(pObjMap[i]) ) )
            pObjMap[i] = NULL;
    assert( p->pObjCopies == NULL );
    p->pObjCopies = pObjMap;
    return pFrames;
}